

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SVM.pb.h
# Opt level: O0

SparseSupportVectors * __thiscall
CoreML::Specification::SupportVectorRegressor::mutable_sparsesupportvectors
          (SupportVectorRegressor *this)

{
  bool bVar1;
  SparseSupportVectors *this_00;
  SupportVectorRegressor *this_local;
  
  bVar1 = has_sparsesupportvectors(this);
  if (!bVar1) {
    clear_supportVectors(this);
    set_has_sparsesupportvectors(this);
    this_00 = (SparseSupportVectors *)operator_new(0x30);
    SparseSupportVectors::SparseSupportVectors(this_00);
    (this->supportVectors_).sparsesupportvectors_ = this_00;
  }
  return (this->supportVectors_).sparsesupportvectors_;
}

Assistant:

inline ::CoreML::Specification::SparseSupportVectors* SupportVectorRegressor::mutable_sparsesupportvectors() {
  if (!has_sparsesupportvectors()) {
    clear_supportVectors();
    set_has_sparsesupportvectors();
    supportVectors_.sparsesupportvectors_ = new ::CoreML::Specification::SparseSupportVectors;
  }
  // @@protoc_insertion_point(field_mutable:CoreML.Specification.SupportVectorRegressor.sparseSupportVectors)
  return supportVectors_.sparsesupportvectors_;
}